

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5ExprNodeTest_STRING(Fts5Expr *pExpr,Fts5ExprNode *pNode)

{
  Fts5ExprPhrase *pFVar1;
  Fts5IndexIter *pFVar2;
  long lVar3;
  Fts5ExprPhrase *pFVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  i64 iMatch;
  i64 iVar9;
  i64 iVar10;
  Fts5PoslistReader *pFVar11;
  ulong uVar12;
  Fts5ExprTerm *pFVar13;
  Fts5PoslistReader *pFVar14;
  ulong uVar15;
  Fts5ExprTerm *pFVar16;
  i64 *piVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  Fts5ExprNearset *pFVar21;
  long lVar22;
  Fts5LookaheadReader *p;
  i64 iLast;
  u8 *puVar23;
  bool bVar24;
  int local_14c;
  Fts5ExprNearset *local_148;
  int n;
  Fts5PoslistReader *local_138;
  Fts5ExprNode *local_130;
  Fts5ExprNearset *local_128;
  u8 *a;
  Fts5Buffer local_118;
  Fts5Expr *local_108;
  Fts5PoslistWriter writer;
  Fts5PoslistReader aStatic [4];
  
  local_128 = pNode->pNear;
  lVar20 = *(long *)local_128->apPhrase;
  iVar7 = pExpr->bDesc;
  local_130 = pNode;
  if (*(long *)(lVar20 + 0x38) == 0) {
    iMatch = **(i64 **)(lVar20 + 0x30);
  }
  else {
    iMatch = fts5ExprSynonymRowid((Fts5ExprTerm *)(lVar20 + 0x20),iVar7,(int *)0x0);
  }
  lVar20 = 0;
  bVar24 = true;
  do {
    bVar5 = bVar24;
    while (bVar24 = bVar5, local_128->nPhrase <= lVar20) {
      lVar20 = 0;
      bVar5 = true;
      if (bVar24) {
        local_130->iRowid = iMatch;
        pFVar21 = local_130->pNear;
        local_14c = 0;
        if (pExpr->pConfig->eDetail != 0) {
          pFVar1 = pFVar21->apPhrase[0];
          (pFVar1->poslist).n = 0;
          iVar7 = 0;
          bVar24 = false;
          for (pFVar13 = pFVar1->aTerm; pFVar13 != (Fts5ExprTerm *)0x0; pFVar13 = pFVar13->pSynonym)
          {
            pFVar2 = pFVar13->pIter;
            if (((pFVar2->bEof == '\0') && (pFVar2->iRowid == iMatch)) && (0 < pFVar2->nData)) {
              (pFVar1->poslist).n = 1;
              bVar24 = true;
            }
          }
          goto LAB_001928da;
        }
        uVar15 = 0;
        local_148 = pFVar21;
        goto LAB_00192430;
      }
    }
    local_138 = *(Fts5PoslistReader **)
                 (&((Fts5ExprTerm *)local_128->apPhrase)->bPrefix + lVar20 * 8);
    local_148 = (Fts5ExprNearset *)((long)local_138 + 0x20);
    local_108 = pExpr;
    for (lVar19 = 0; lVar19 < *(int *)((long)local_138 + 0x18); lVar19 = lVar19 + 1) {
      pFVar13 = (Fts5ExprTerm *)((long)local_148 + lVar19 * 0x20);
      iVar10 = iMatch;
      if (*(long *)((long)local_148 + lVar19 * 0x20 + 0x18) == 0) {
        pFVar2 = pFVar13->pIter;
        lVar3 = pFVar2->iRowid;
        if ((lVar3 != iMatch) && (pFVar2->bEof == '\0')) {
          bVar24 = false;
          if ((iVar7 == 0 && lVar3 < iMatch) || (iVar10 = lVar3, iVar7 != 0 && iMatch < lVar3)) {
            iVar6 = sqlite3Fts5IterNextFrom(pFVar2,iMatch);
            if ((iVar6 != 0) || (pFVar2->bEof != '\0')) {
              local_130->bEof = 1;
              return iVar6;
            }
            iVar10 = pFVar2->iRowid;
            goto LAB_00192385;
          }
        }
      }
      else {
        iVar9 = fts5ExprSynonymRowid(pFVar13,iVar7,(int *)0x0);
        if (iVar9 != iMatch) {
          aStatic[0].a._0_4_ = 0;
          iVar6 = 0;
          for (pFVar16 = pFVar13; (iVar6 == 0 && (pFVar16 != (Fts5ExprTerm *)0x0));
              pFVar16 = pFVar16->pSynonym) {
            pFVar2 = pFVar16->pIter;
            iVar6 = 0;
            if (pFVar2->bEof == '\0') {
              if ((iVar7 == 0 && pFVar2->iRowid < iMatch) || (iVar7 != 0 && iMatch < pFVar2->iRowid)
                 ) {
                iVar6 = sqlite3Fts5IterNextFrom(pFVar2,iMatch);
              }
            }
          }
          if ((iVar6 != 0) ||
             (iVar10 = fts5ExprSynonymRowid(pFVar13,iVar7,(int *)aStatic), (int)aStatic[0].a != 0))
          {
            local_130->bEof = 1;
            local_130->bNomatch = 0;
            return iVar6;
          }
LAB_00192385:
          bVar24 = false;
        }
      }
      iMatch = iVar10;
    }
    lVar20 = lVar20 + 1;
    pExpr = local_108;
  } while( true );
LAB_00192430:
  iVar7 = local_14c;
  if (local_14c == 0) {
    if ((long)pFVar21->nPhrase <= (long)uVar15) {
      iVar7 = 0;
      goto LAB_001926d6;
    }
    pFVar1 = pFVar21->apPhrase[uVar15];
    iVar7 = pFVar1->nTerm;
    if ((((long)iVar7 < 2) && (pFVar1->aTerm[0].pSynonym == (Fts5ExprTerm *)0x0)) &&
       ((pFVar21->pColset == (Fts5Colset *)0x0 && (pFVar1->aTerm[0].bFirst == '\0')))) {
      pFVar2 = pFVar1->aTerm[0].pIter;
      sqlite3Fts5BufferSet(&local_14c,&pFVar1->poslist,pFVar2->nData,pFVar2->pData);
      goto LAB_00192683;
    }
    writer.iPrev = 0;
    local_138 = (Fts5PoslistReader *)CONCAT71(local_138._1_7_,pFVar1->aTerm[0].bFirst);
    (pFVar1->poslist).n = 0;
    pFVar11 = aStatic;
    if (4 < iVar7) {
      pFVar11 = (Fts5PoslistReader *)sqlite3_malloc64((long)iVar7 << 5);
      if (pFVar11 == (Fts5PoslistReader *)0x0) {
        local_14c = 7;
        iVar7 = 7;
        goto LAB_001926d6;
      }
      iVar7 = pFVar1->nTerm;
    }
    local_128 = (Fts5ExprNearset *)&pFVar1->poslist;
    memset(pFVar11,0,(long)iVar7 << 5);
    lVar20 = 0;
    pFVar14 = pFVar11;
    pFVar4 = pFVar1;
    do {
      uVar12 = (ulong)pFVar1->nTerm;
      if ((long)uVar12 <= lVar20) {
LAB_0019256c:
        bVar24 = true;
        uVar18 = pFVar11->iPos;
        lVar20 = 0;
        do {
          bVar5 = bVar24;
          while (bVar24 = bVar5, (int)uVar12 <= lVar20) {
            lVar20 = 0;
            bVar5 = true;
            if (bVar24) {
              if ((((char)local_138 == '\0') || ((uVar18 & 0x7fffffff) == 0)) &&
                 (iVar7 = sqlite3Fts5PoslistWriterAppend((Fts5Buffer *)local_128,&writer,uVar18),
                 iVar7 != 0)) goto LAB_00192633;
              lVar20 = -1;
              pFVar14 = pFVar11;
              goto LAB_00192606;
            }
          }
          lVar19 = uVar18 + lVar20;
          if (pFVar11[lVar20].iPos != lVar19) {
            while (lVar3 = pFVar11[lVar20].iPos, lVar3 < lVar19) {
              iVar7 = sqlite3Fts5PoslistReaderNext(pFVar11 + lVar20);
              if (iVar7 != 0) goto LAB_00192626;
            }
            if (lVar19 < lVar3) {
              uVar18 = lVar3 - lVar20;
            }
            uVar12 = (ulong)(uint)pFVar1->nTerm;
            bVar24 = false;
          }
          lVar20 = lVar20 + 1;
        } while( true );
      }
      n = 0;
      a = (u8 *)0x0;
      if (pFVar4->aTerm[0].pSynonym == (Fts5ExprTerm *)0x0) {
        pFVar2 = pFVar4->aTerm[0].pIter;
        a = pFVar2->pData;
        n = pFVar2->nData;
        bVar24 = false;
      }
      else {
        local_118.p = (u8 *)0x0;
        local_118.n = 0;
        local_118.nSpace = 0;
        iVar7 = fts5ExprSynonymList(pFVar4->aTerm,local_130->iRowid,&local_118,&a,&n);
        if (iVar7 != 0) {
          sqlite3_free(a);
          goto LAB_00192633;
        }
        bVar24 = a == local_118.p;
      }
      sqlite3Fts5PoslistReaderInit(a,n,pFVar14);
      pFVar14->bFlag = bVar24;
      if (pFVar14->bEof != '\0') goto LAB_00192626;
      lVar20 = lVar20 + 1;
      pFVar14 = pFVar14 + 1;
      pFVar4 = (Fts5ExprPhrase *)pFVar4->aTerm;
    } while( true );
  }
  goto LAB_001926d6;
LAB_00192606:
  uVar12 = (ulong)pFVar1->nTerm;
  lVar20 = lVar20 + 1;
  if ((long)uVar12 <= lVar20) goto LAB_0019256c;
  iVar7 = sqlite3Fts5PoslistReaderNext(pFVar14);
  pFVar14 = pFVar14 + 1;
  if (iVar7 != 0) goto LAB_00192626;
  goto LAB_00192606;
LAB_00192626:
  iVar7 = 0;
LAB_00192633:
  iVar6 = (pFVar1->poslist).n;
  puVar23 = &pFVar11->bFlag;
  for (lVar20 = 0; lVar20 < pFVar1->nTerm; lVar20 = lVar20 + 1) {
    if (*puVar23 != '\0') {
      sqlite3_free(((Fts5PoslistReader *)(puVar23 + -0x10))->a);
    }
    puVar23 = puVar23 + 0x20;
  }
  if (pFVar11 != aStatic) {
    sqlite3_free(pFVar11);
  }
  pFVar21 = local_148;
  local_14c = iVar7;
  if (iVar6 < 1) goto LAB_001926d6;
LAB_00192683:
  uVar15 = uVar15 + 1;
  goto LAB_00192430;
LAB_001927df:
  lVar22 = lVar20 - ((long)local_148->nNear + (long)local_148->apPhrase[lVar19]->nTerm);
  lVar3 = *(long *)((long)pFVar11 + lVar19 * 0x30 + 0x10);
  if ((lVar20 < lVar3) || (lVar3 < lVar22)) {
    p = (Fts5LookaheadReader *)(lVar19 * 0x30 + (long)pFVar11);
    while (lVar3 = p->iPos, lVar3 < lVar22) {
      iVar7 = fts5LookaheadReaderNext(p);
      if (iVar7 != 0) goto LAB_001928b2;
    }
    if (lVar20 < lVar3) {
      lVar20 = lVar3;
    }
    bVar24 = false;
  }
  lVar19 = lVar19 + 1;
  goto LAB_001927c5;
LAB_001928b2:
  iVar6 = *(int *)(*(long *)&pFVar11[1].n + 8);
  iVar7 = (int)local_118.p;
  if (pFVar11 != aStatic) {
    sqlite3_free(pFVar11);
  }
  bVar24 = 0 < iVar6;
  goto LAB_001928da;
LAB_001926d6:
  bVar24 = false;
  if (pFVar21->nPhrase == (int)uVar15) {
    if (uVar15 == 1) {
      bVar24 = true;
    }
    else {
      local_118.p = (u8 *)CONCAT44(local_118.p._4_4_,iVar7);
      if (uVar15 < 5) {
        pFVar11 = aStatic;
        memset(pFVar11,0,0xc0);
      }
      else {
        pFVar11 = (Fts5PoslistReader *)
                  sqlite3Fts5MallocZero((int *)&local_118,(uVar15 & 0xffffffff) * 0x30);
        iVar7 = (int)local_118.p;
      }
      if (iVar7 == 0) {
        pFVar14 = pFVar11;
        for (lVar20 = 0; lVar20 < pFVar21->nPhrase; lVar20 = lVar20 + 1) {
          pFVar1 = pFVar21->apPhrase[lVar20];
          puVar23 = (pFVar1->poslist).p;
          iVar7 = (pFVar1->poslist).n;
          pFVar14->iPos = 0;
          pFVar14->n = 0;
          pFVar14->i = 0;
          pFVar14->bFlag = '\0';
          pFVar14->bEof = '\0';
          *(undefined6 *)&pFVar14->field_0x12 = 0;
          pFVar14->a = puVar23;
          pFVar14->n = iVar7;
          fts5LookaheadReaderNext((Fts5LookaheadReader *)pFVar14);
          fts5LookaheadReaderNext((Fts5LookaheadReader *)pFVar14);
          (pFVar1->poslist).n = 0;
          *(Fts5Buffer **)&pFVar14[1].n = &pFVar1->poslist;
          pFVar14 = (Fts5PoslistReader *)&pFVar14[1].bFlag;
          pFVar21 = local_148;
        }
        local_138 = pFVar11 + 1;
        do {
          lVar20._0_1_ = pFVar11->bFlag;
          lVar20._1_1_ = pFVar11->bEof;
          lVar20._2_6_ = *(undefined6 *)&pFVar11->field_0x12;
          lVar19 = 0;
          bVar24 = true;
LAB_001927c5:
          pFVar21 = local_148;
          uVar8 = local_148->nPhrase;
          do {
            if (lVar19 < (int)uVar8) goto LAB_001927df;
            lVar19 = 0;
            bVar5 = !bVar24;
            bVar24 = true;
          } while (bVar5);
          pFVar14 = local_138;
          for (lVar20 = 0; lVar20 < (int)uVar8; lVar20 = lVar20 + 1) {
            if (((*(Fts5Buffer **)&pFVar14->n)->n == 0) ||
               (*(u8 **)&pFVar14[-1].bFlag != pFVar14->a)) {
              sqlite3Fts5PoslistWriterAppend
                        (*(Fts5Buffer **)&pFVar14->n,(Fts5PoslistWriter *)pFVar14,
                         (i64)*(u8 **)&pFVar14[-1].bFlag);
              uVar8 = pFVar21->nPhrase;
            }
            pFVar14 = (Fts5PoslistReader *)&pFVar14[1].bFlag;
          }
          lVar20 = pFVar11->iPos;
          uVar12 = 0;
          uVar15 = (ulong)uVar8;
          if ((int)uVar8 < 1) {
            uVar15 = uVar12;
          }
          uVar18 = 0;
          piVar17 = &pFVar11->iPos;
          for (; uVar15 != uVar12; uVar12 = uVar12 + 1) {
            if (*piVar17 < lVar20) {
              uVar18 = uVar12 & 0xffffffff;
              lVar20 = *piVar17;
            }
            piVar17 = piVar17 + 6;
          }
          iVar7 = fts5LookaheadReaderNext
                            ((Fts5LookaheadReader *)((long)(int)uVar18 * 0x30 + (long)pFVar11));
          if (iVar7 != 0) goto LAB_001928b2;
        } while( true );
      }
    }
  }
LAB_001928da:
  local_130->bNomatch = (uint)(!bVar24 && iVar7 == 0);
  return iVar7;
}

Assistant:

static int fts5ExprNodeTest_STRING(
  Fts5Expr *pExpr,                /* Expression pPhrase belongs to */
  Fts5ExprNode *pNode
){
  Fts5ExprNearset *pNear = pNode->pNear;
  Fts5ExprPhrase *pLeft = pNear->apPhrase[0];
  int rc = SQLITE_OK;
  i64 iLast;                      /* Lastest rowid any iterator points to */
  int i, j;                       /* Phrase and token index, respectively */
  int bMatch;                     /* True if all terms are at the same rowid */
  const int bDesc = pExpr->bDesc;

  /* Check that this node should not be FTS5_TERM */
  assert( pNear->nPhrase>1 
       || pNear->apPhrase[0]->nTerm>1 
       || pNear->apPhrase[0]->aTerm[0].pSynonym
       || pNear->apPhrase[0]->aTerm[0].bFirst
  );

  /* Initialize iLast, the "lastest" rowid any iterator points to. If the
  ** iterator skips through rowids in the default ascending order, this means
  ** the maximum rowid. Or, if the iterator is "ORDER BY rowid DESC", then it
  ** means the minimum rowid.  */
  if( pLeft->aTerm[0].pSynonym ){
    iLast = fts5ExprSynonymRowid(&pLeft->aTerm[0], bDesc, 0);
  }else{
    iLast = pLeft->aTerm[0].pIter->iRowid;
  }

  do {
    bMatch = 1;
    for(i=0; i<pNear->nPhrase; i++){
      Fts5ExprPhrase *pPhrase = pNear->apPhrase[i];
      for(j=0; j<pPhrase->nTerm; j++){
        Fts5ExprTerm *pTerm = &pPhrase->aTerm[j];
        if( pTerm->pSynonym ){
          i64 iRowid = fts5ExprSynonymRowid(pTerm, bDesc, 0);
          if( iRowid==iLast ) continue;
          bMatch = 0;
          if( fts5ExprSynonymAdvanceto(pTerm, bDesc, &iLast, &rc) ){
            pNode->bNomatch = 0;
            pNode->bEof = 1;
            return rc;
          }
        }else{
          Fts5IndexIter *pIter = pPhrase->aTerm[j].pIter;
          if( pIter->iRowid==iLast || pIter->bEof ) continue;
          bMatch = 0;
          if( fts5ExprAdvanceto(pIter, bDesc, &iLast, &rc, &pNode->bEof) ){
            return rc;
          }
        }
      }
    }
  }while( bMatch==0 );

  pNode->iRowid = iLast;
  pNode->bNomatch = ((0==fts5ExprNearTest(&rc, pExpr, pNode)) && rc==SQLITE_OK);
  assert( pNode->bEof==0 || pNode->bNomatch==0 );

  return rc;
}